

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetRepeatedMessage
          (ExtensionSet *this,int number,int index)

{
  CppType CVar1;
  const_iterator cVar2;
  LogMessage *pLVar3;
  Type *pTVar4;
  LogFinisher local_55;
  int number_local;
  LogMessage local_50;
  
  number_local = number;
  cVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                  *)this,&number_local);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->extensions_)._M_t._M_impl.super__Rb_tree_header) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x2d5);
    pLVar3 = LogMessage::operator<<(&local_50,"CHECK failed: iter != extensions_.end(): ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_55,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  if (*(char *)((long)&cVar2._M_node[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x2d6);
    pLVar3 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                       );
    LogFinisher::operator=(&local_55,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  CVar1 = anon_unknown_29::cpp_type(*(FieldType *)&cVar2._M_node[1]._M_left);
  if (CVar1 != CPPTYPE_MESSAGE) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x2d6);
    pLVar3 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                       );
    LogFinisher::operator=(&local_55,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  pTVar4 = RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                     ((RepeatedPtrFieldBase *)cVar2._M_node[1]._M_parent,index);
  return pTVar4;
}

Assistant:

const MessageLite& ExtensionSet::GetRepeatedMessage(
    int number, int index) const {
  ExtensionMap::const_iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(iter->second, REPEATED, MESSAGE);
  return iter->second.repeated_message_value->Get(index);
}